

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::IsLinear(ON_PolyCurve *this,double tolerance)

{
  int iVar1;
  int iVar2;
  ON_Curve **ppOVar3;
  int local_28;
  int count;
  int i;
  bool rc;
  double tolerance_local;
  ON_PolyCurve *this_local;
  
  count._3_1_ = 0;
  iVar1 = Count(this);
  if (iVar1 == 1) {
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,0);
    iVar1 = (*((*ppOVar3)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])(tolerance);
    count._3_1_ = (byte)iVar1;
  }
  else if (1 < iVar1) {
    count._3_1_ = 1;
    for (local_28 = 0; count._3_1_ != 0 && local_28 < iVar1; local_28 = local_28 + 1) {
      ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_28);
      if (*ppOVar3 == (ON_Curve *)0x0) {
        count._3_1_ = 0;
      }
      else {
        ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_28);
        iVar2 = (*((*ppOVar3)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])(tolerance);
        count._3_1_ = (byte)iVar2 & 1;
      }
    }
    if (count._3_1_ != 0) {
      count._3_1_ = ON_Curve::IsLinear(&this->super_ON_Curve,tolerance);
    }
  }
  this_local._7_1_ = (bool)(count._3_1_ & 1);
  return this_local._7_1_;
}

Assistant:

bool
ON_PolyCurve::IsLinear( // true if curve locus is a line segment
      double tolerance // tolerance to use when checking linearity
      ) const
{
  bool rc = false;
  int i, count = Count();
	if ( count==1)
		return m_segment[0]->IsLinear(tolerance);
  
	else if ( count > 1 ) {
    rc = true;
    for ( i = 0; rc && i < count; i++ ) {
      if ( !m_segment[i] )
        rc = false;
      else
        rc = m_segment[i]->IsLinear(tolerance);
    
    }
    if (rc)
      rc = ON_Curve::IsLinear(tolerance);
  }
  return rc;
}